

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::NewScObjectNoArg(Var instance,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *pJVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  Attributes AVar7;
  BOOL BVar8;
  JavascriptProxy *this;
  RecyclableObject *pRVar9;
  FunctionInfo *functionInfo;
  RecyclableObject *instance_00;
  undefined4 *puVar10;
  JavascriptArray *object;
  JavascriptMethod p_Var11;
  RecyclableObject *ptr;
  JavascriptFunction *pJVar12;
  ConstructorCache *pCVar13;
  DynamicObject *value;
  Var pvVar14;
  ScriptContext *pSVar15;
  Arguments local_60;
  ScriptContext *local_50;
  void *local_48;
  Var dummy;
  undefined1 local_32;
  byte local_31;
  
  bVar5 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar5) {
    this = UnsafeVarTo<Js::JavascriptProxy>(instance);
  }
  else {
    this = (JavascriptProxy *)0x0;
  }
  if (this == (JavascriptProxy *)0x0) {
    functionInfo = GetConstructorFunctionInfo(instance,requestContext);
    pRVar9 = VarTo<Js::RecyclableObject>(instance);
    if (functionInfo == (FunctionInfo *)JavascriptObject::EntryInfo::NewInstance) {
      if ((JavascriptObject::EntryInfo::NewInstance[0x18] & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18c1,
                                    "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                    ,
                                    "(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                   );
        if (!bVar5) goto LAB_00ac49ca;
        *puVar10 = 0;
      }
      pJVar3 = (((pRVar9->type).ptr)->javascriptLibrary).ptr;
      object = (JavascriptArray *)JavascriptLibrary::CreateObject(pJVar3,true,0);
      bVar5 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (bVar5) {
        pRVar9 = JavascriptProxy::AutoProxyWrapper(object);
        object = (JavascriptArray *)VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar9);
      }
      if (*(char *)((long)&(object->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                           type.ptr[1].javascriptLibrary.ptr + 1) == '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18cf,"(newObjectType->GetIsShared())",
                                    "newObjectType->GetIsShared()");
        if (!bVar5) goto LAB_00ac49ca;
        *puVar10 = 0;
      }
      pJVar12 = VarTo<Js::JavascriptFunction>(instance);
      pCVar13 = JavascriptFunction::GetConstructorCache(pJVar12);
      if ((pCVar13->content).updateAfterCtor == true) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18d2,
                                    "(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor())",
                                    "!constructor->GetConstructorCache()->NeedsUpdateAfterCtor()");
        if (!bVar5) {
LAB_00ac49ca:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      pSVar15 = (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr;
    }
    else {
      if (functionInfo != (FunctionInfo *)JavascriptArray::EntryInfo::NewInstance) {
        local_50 = requestContext;
        if (functionInfo == (FunctionInfo *)0x0) {
          instance_00 = (RecyclableObject *)NewScObjectHostDispatchOrProxy(pRVar9,requestContext);
        }
        else {
          instance_00 = (RecyclableObject *)
                        NewScObjectCommon(pRVar9,functionInfo,requestContext,false);
        }
        pTVar2 = ((((((pRVar9->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  scriptContext.ptr)->threadContext;
        local_32 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        dummy = pTVar2;
        AVar7 = FunctionInfo::GetAttributes(pRVar9);
        bVar5 = ThreadContext::HasNoSideEffect(pTVar2,pRVar9,AVar7);
        pSVar15 = local_50;
        if (bVar5) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled((ThreadContext *)dummy);
          pSVar15 = local_50;
          if (*(char *)((long)dummy + 0x108) == '\x01') {
            Throw::FatalJsReentrancyError();
          }
          p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
          CheckIsExecutable(pRVar9,p_Var11);
          p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
          ptr = (RecyclableObject *)
                (*p_Var11)(pRVar9,(CallInfo)pRVar9,"ex < m_data.globalObjTypeSpecFldInfoCount",0,0,0
                           ,0,"ex < m_data.globalObjTypeSpecFldInfoCount",instance_00);
          bVar5 = ThreadContext::IsOnStack(ptr);
        }
        else {
          if ((*(byte *)((long)dummy + 0x1542) & 1) != 0) {
            *(byte *)((long)dummy + 0x1570) = *(byte *)((long)dummy + 0x1570) | 5;
            ptr = (((((((((pRVar9->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
                      .scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
            goto LAB_00ac48b4;
          }
          if ((AVar7 & HasNoSideEffect) == None) {
            local_31 = *(byte *)((long)dummy + 0x1570);
            ThreadContext::CheckAndResetReentrancySafeOrHandled((ThreadContext *)dummy);
            if (*(char *)((long)dummy + 0x108) == '\x01') {
              Throw::FatalJsReentrancyError();
            }
            p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
            CheckIsExecutable(pRVar9,p_Var11);
            p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
            ptr = (RecyclableObject *)
                  (*p_Var11)(pRVar9,(CallInfo)pRVar9,"ex < m_data.globalObjTypeSpecFldInfoCount",0,0
                             ,0,0,"ex < m_data.globalObjTypeSpecFldInfoCount",instance_00);
            *(byte *)((long)dummy + 0x1570) = local_31 | 5;
            goto LAB_00ac48b4;
          }
          ThreadContext::CheckAndResetReentrancySafeOrHandled((ThreadContext *)dummy);
          if (*(char *)((long)dummy + 0x108) == '\x01') {
            Throw::FatalJsReentrancyError();
          }
          p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
          CheckIsExecutable(pRVar9,p_Var11);
          p_Var11 = RecyclableObject::GetEntryPoint(pRVar9);
          ptr = (RecyclableObject *)
                (*p_Var11)(pRVar9,(CallInfo)pRVar9,"ex < m_data.globalObjTypeSpecFldInfoCount",0,0,0
                           ,0,"ex < m_data.globalObjTypeSpecFldInfoCount",instance_00);
          bVar5 = ThreadContext::IsOnStack(ptr);
        }
        if (bVar5 != false) {
          *(byte *)((long)dummy + 0x1570) = *(byte *)((long)dummy + 0x1570) | 5;
        }
LAB_00ac48b4:
        *(undefined1 *)((long)dummy + 0x109) = local_32;
        BVar8 = IsObject(ptr);
        if (BVar8 != 0) {
          instance_00 = ptr;
        }
        bVar5 = VarIs<Js::JavascriptFunction>(instance);
        if (bVar5) {
          pJVar12 = UnsafeVarTo<Js::JavascriptFunction>(instance);
        }
        else {
          pJVar12 = (JavascriptFunction *)0x0;
        }
        if (pJVar12 == (JavascriptFunction *)0x0) {
          pCVar13 = (ConstructorCache *)0x0;
        }
        else {
          pCVar13 = JavascriptFunction::GetConstructorCache(pJVar12);
        }
        if ((pCVar13 != (ConstructorCache *)0x0) && ((pCVar13->content).updateAfterCtor == true)) {
          UpdateNewScObjectCache(pRVar9,instance_00,pSVar15);
        }
        bVar5 = ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
        if (!bVar5) {
          return instance_00;
        }
        pRVar9 = JavascriptProxy::AutoProxyWrapper(instance_00);
        value = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar9);
        pvVar14 = CrossSite::MarshalVar
                            (pSVar15,value,
                             (((((value->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                             ->super_JavascriptLibraryBase).scriptContext.ptr);
        return pvVar14;
      }
      if ((JavascriptArray::EntryInfo::NewInstance[0x18] & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18df,
                                    "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                    ,
                                    "(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                   );
        if (!bVar5) goto LAB_00ac49ca;
        *puVar10 = 0;
      }
      pJVar3 = (((pRVar9->type).ptr)->javascriptLibrary).ptr;
      object = JavascriptLibrary::CreateArray(pJVar3);
      bVar5 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (bVar5) {
        object = (JavascriptArray *)JavascriptProxy::AutoProxyWrapper(object);
      }
      if (*(char *)((long)&(object->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                           type.ptr[1].javascriptLibrary.ptr + 1) == '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18ed,"(newArrayType->GetIsShared())",
                                    "newArrayType->GetIsShared()");
        if (!bVar5) goto LAB_00ac49ca;
        *puVar10 = 0;
      }
      pJVar12 = VarTo<Js::JavascriptFunction>(instance);
      pCVar13 = JavascriptFunction::GetConstructorCache(pJVar12);
      if ((pCVar13->content).updateAfterCtor == true) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18f0,
                                    "(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor())",
                                    "!constructor->GetConstructorCache()->NeedsUpdateAfterCtor()");
        if (!bVar5) goto LAB_00ac49ca;
        *puVar10 = 0;
      }
      pSVar15 = (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr;
    }
    if (pSVar15 == requestContext) {
      return object;
    }
    CrossSite::MarshalDynamicObjectAndPrototype(requestContext,(DynamicObject *)object);
    return object;
  }
  local_48 = (void *)0x0;
  pTVar2 = requestContext->threadContext;
  bVar5 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  AVar7 = FunctionInfo::GetAttributes((RecyclableObject *)this);
  bVar6 = ThreadContext::HasNoSideEffect(pTVar2,(RecyclableObject *)this,AVar7);
  if (bVar6) {
    local_60.Info = (Type)((long)"index < m_data.globalObjTypeSpecFldInfoCount" + 3);
    local_60.Values = &local_48;
    pRVar9 = (RecyclableObject *)
             JavascriptProxy::ConstructorTrap
                       (this,&local_60,requestContext,(AuxArray<unsigned_int> *)0x0);
    bVar6 = ThreadContext::IsOnStack(pRVar9);
  }
  else {
    if ((pTVar2->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
      pRVar9 = (((((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00ac43c5;
    }
    if ((AVar7 & HasNoSideEffect) == None) {
      IVar1 = pTVar2->implicitCallFlags;
      local_60.Info = (Type)((long)"index < m_data.globalObjTypeSpecFldInfoCount" + 3);
      local_60.Values = &local_48;
      pRVar9 = (RecyclableObject *)
               JavascriptProxy::ConstructorTrap
                         (this,&local_60,requestContext,(AuxArray<unsigned_int> *)0x0);
      pTVar2->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ac43c5;
    }
    local_60.Info = (Type)((long)"index < m_data.globalObjTypeSpecFldInfoCount" + 3);
    local_60.Values = &local_48;
    pRVar9 = (RecyclableObject *)
             JavascriptProxy::ConstructorTrap
                       (this,&local_60,requestContext,(AuxArray<unsigned_int> *)0x0);
    bVar6 = ThreadContext::IsOnStack(pRVar9);
  }
  if (bVar6 != false) {
    pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ac43c5:
  pTVar2->reentrancySafeOrHandled = bVar5;
  return pRVar9;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArg(Var instance, ScriptContext * requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(NewScObjectNoArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            Var dummy = nullptr;
            Arguments args(CallInfo(CallFlags_New, 1), &dummy);
            return requestContext->GetThreadContext()->ExecuteImplicitCall(proxy, Js::ImplicitCall_Accessor, [=]()->Js::Var
            {
                return proxy->ConstructorTrap(args, requestContext, 0);
            });
        }

        FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(instance, requestContext);
        RecyclableObject * object = VarTo<RecyclableObject>(instance);

        if (functionInfo == &JavascriptObject::EntryInfo::NewInstance)
        {
            // Fast path for new Object()
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            DynamicObject * newObject = library->CreateObject(true);
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            }
#endif

#if DBG
            DynamicType* newObjectType = newObject->GetDynamicType();
            Assert(newObjectType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newObject);
            }

            return newObject;
        }
        else if (functionInfo == &JavascriptArray::EntryInfo::NewInstance)
        {
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            JavascriptArray * newArray = library->CreateArray();
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newArray));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newArray = static_cast<JavascriptArray*>(JavascriptProxy::AutoProxyWrapper(newArray));
            }
#endif

#if DBG
            DynamicType* newArrayType = newArray->GetDynamicType();
            Assert(newArrayType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newArray);
            }
            return newArray;
        }

        Var newObject = functionInfo != nullptr ?
            JavascriptOperators::NewScObjectCommon(object, functionInfo, requestContext) :
            JavascriptOperators::NewScObjectHostDispatchOrProxy(object, requestContext);

        ThreadContext * threadContext = object->GetScriptContext()->GetThreadContext();
        Var returnVar = threadContext->ExecuteImplicitCall(object, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, object, CallInfo(CallFlags_New, 1), newObject);
        });
        if (JavascriptOperators::IsObject(returnVar))
        {
            newObject = returnVar;
        }

        ConstructorCache * constructorCache = nullptr;
        JavascriptFunction *function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
        if (function)
        {
            constructorCache = function->GetConstructorCache();
        }

        if (constructorCache != nullptr && constructorCache->NeedsUpdateAfterCtor())
        {
            JavascriptOperators::UpdateNewScObjectCache(object, newObject, requestContext);
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            DynamicObject* newDynamicObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            // this might come from a different scriptcontext.
            newObject = CrossSite::MarshalVar(requestContext, newDynamicObject, newDynamicObject->GetScriptContext());
        }
#endif

        return newObject;
        JIT_HELPER_END(NewScObjectNoArg);
    }